

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_UnsupportedECHConfig_Test::TestBody
          (SSLTest_UnsupportedECHConfig_Test *this)

{
  bool bVar1;
  int iVar2;
  EVP_HPKE_KEM *kem;
  char *in_R9;
  AssertHelper local_390;
  AssertionResult gtest_ar__10;
  AssertHelper local_378;
  UniquePtr<SSL_ECH_KEYS> keys;
  AssertionResult gtest_ar__8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ech_config;
  ECHConfigParams invalid_public_name;
  ECHConfigParams extensions;
  ECHConfigParams unsupported_aead;
  ECHConfigParams unsupported_kdf;
  ECHConfigParams unsupported_version;
  ScopedEVP_HPKE_KEY key;
  
  keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)SSL_ECH_KEYS_new();
  unsupported_kdf.public_name._M_dataplus._M_p = (pointer)0x0;
  unsupported_kdf.version._0_1_ =
       (tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
       keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0;
  if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
      keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&unsupported_aead);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&unsupported_version,(internal *)&unsupported_kdf,
               (AssertionResult *)0x2f7801,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&extensions,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x81c,(char *)CONCAT62(unsupported_version._2_6_,unsupported_version.version));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&extensions,(Message *)&unsupported_aead);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&extensions);
    std::__cxx11::string::~string((string *)&unsupported_version);
    if ((long *)CONCAT44(unsupported_aead._4_4_,unsupported_aead._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(unsupported_aead._4_4_,unsupported_aead._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&unsupported_kdf.public_name);
    goto LAB_0015ccc8;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&unsupported_kdf.public_name);
  EVP_HPKE_KEY_zero(&key.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(&key.ctx_,kem);
  unsupported_kdf.public_name._M_dataplus._M_p = (pointer)0x0;
  unsupported_kdf.version._0_1_ = iVar2 != 0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&unsupported_aead);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&unsupported_version,(internal *)&unsupported_kdf,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&extensions,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x81e,(char *)CONCAT62(unsupported_version._2_6_,unsupported_version.version));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&extensions,(Message *)&unsupported_aead);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&extensions);
    std::__cxx11::string::~string((string *)&unsupported_version);
    if ((long *)CONCAT44(unsupported_aead._4_4_,unsupported_aead._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(unsupported_aead._4_4_,unsupported_aead._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&unsupported_kdf.public_name);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&unsupported_kdf.public_name);
    ECHConfigParams::ECHConfigParams(&unsupported_version);
    unsupported_version.version = 0xffff;
    ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unsupported_version.key = &key.ctx_;
    bVar1 = MakeECHConfig(&ech_config,&unsupported_version);
    unsupported_aead.version._0_1_ = bVar1;
    unsupported_aead.public_name._M_dataplus._M_p = (pointer)0x0;
    if (bVar1) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&unsupported_aead.public_name);
      iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                               keys._M_t.
                               super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                               ech_config.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)ech_config.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)ech_config.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
      unsupported_aead.public_name._M_dataplus._M_p = (pointer)0x0;
      unsupported_aead.version._0_1_ = iVar2 == 0;
      if (iVar2 != 0) {
        testing::Message::Message((Message *)&extensions);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&unsupported_kdf,(internal *)&unsupported_aead,
                   (AssertionResult *)
                   "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&invalid_public_name,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x828,(char *)CONCAT71(unsupported_kdf._1_7_,(undefined1)unsupported_kdf.version
                                          ));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&invalid_public_name,(Message *)&extensions);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&invalid_public_name);
        std::__cxx11::string::~string((string *)&unsupported_kdf);
        if ((long *)CONCAT44(extensions._4_4_,extensions._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(extensions._4_4_,extensions._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&unsupported_aead.public_name);
      ECHConfigParams::ECHConfigParams(&unsupported_kdf);
      unsupported_aead.version = 2;
      unsupported_aead.config_id = 1;
      unsupported_kdf.key = &key.ctx_;
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_assign_aux<unsigned_short_const*>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                 &unsupported_kdf.cipher_suites,&unsupported_aead);
      bVar1 = MakeECHConfig(&ech_config,&unsupported_kdf);
      extensions.version._0_1_ = bVar1;
      extensions.public_name._M_dataplus._M_p = (pointer)0x0;
      if (bVar1) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&extensions.public_name);
        iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                 keys._M_t.
                                 super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                 ech_config.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)ech_config.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)ech_config.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
        extensions.public_name._M_dataplus._M_p = (pointer)0x0;
        extensions.version._0_1_ = iVar2 == 0;
        if (iVar2 != 0) {
          testing::Message::Message((Message *)&invalid_public_name);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&unsupported_aead,(internal *)&extensions,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                     ,"true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x832,(char *)CONCAT44(unsupported_aead._4_4_,unsupported_aead._0_4_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__8,(Message *)&invalid_public_name);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
          std::__cxx11::string::~string((string *)&unsupported_aead);
          if ((long *)CONCAT44(invalid_public_name._4_4_,invalid_public_name._0_4_) != (long *)0x0)
          {
            (**(code **)(*(long *)CONCAT44(invalid_public_name._4_4_,invalid_public_name._0_4_) + 8)
            )();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&extensions.public_name);
        ECHConfigParams::ECHConfigParams(&unsupported_aead);
        extensions.version = 1;
        extensions.config_id = 0xffff;
        unsupported_aead.key = &key.ctx_;
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_assign_aux<unsigned_short_const*>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                   &unsupported_aead.cipher_suites,&extensions);
        bVar1 = MakeECHConfig(&ech_config,&unsupported_aead);
        invalid_public_name.version._0_1_ = bVar1;
        invalid_public_name.public_name._M_dataplus._M_p = (pointer)0x0;
        if (bVar1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&invalid_public_name.public_name);
          iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                   keys._M_t.
                                   super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                   ech_config.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)ech_config.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ech_config.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
          invalid_public_name.public_name._M_dataplus._M_p = (pointer)0x0;
          invalid_public_name.version._0_1_ = iVar2 == 0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)&gtest_ar__8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&extensions,(internal *)&invalid_public_name,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                       ,"true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x839,(char *)CONCAT44(extensions._4_4_,extensions._0_4_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
            std::__cxx11::string::~string((string *)&extensions);
            if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&invalid_public_name.public_name);
          ECHConfigParams::ECHConfigParams(&extensions);
          invalid_public_name.version = 0x100;
          invalid_public_name.config_id = 0;
          extensions.key = &key.ctx_;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<unsigned_char_const*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&extensions.extensions,
                     &invalid_public_name);
          gtest_ar__8.success_ = MakeECHConfig(&ech_config,&extensions);
          gtest_ar__8.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (gtest_ar__8.success_) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__8.message_);
            iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                     keys._M_t.
                                     super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1
                                     ,ech_config.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                     (long)ech_config.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ech_config.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
            gtest_ar__8.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__8.success_ = iVar2 == 0;
            if (!gtest_ar__8.success_) {
              testing::Message::Message((Message *)&gtest_ar__10);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&invalid_public_name,(internal *)&gtest_ar__8,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_390,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x843,(char *)CONCAT44(invalid_public_name._4_4_,invalid_public_name._0_4_
                                                ));
              testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar__10);
              testing::internal::AssertHelper::~AssertHelper(&local_390);
              std::__cxx11::string::~string((string *)&invalid_public_name);
              if ((long *)CONCAT71(gtest_ar__10._1_7_,gtest_ar__10.success_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(gtest_ar__10._1_7_,gtest_ar__10.success_) + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__8.message_);
            ECHConfigParams::ECHConfigParams(&invalid_public_name);
            invalid_public_name.key = &key.ctx_;
            std::__cxx11::string::assign((char *)&invalid_public_name.public_name);
            gtest_ar__10.success_ = MakeECHConfig(&ech_config,&invalid_public_name);
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (gtest_ar__10.success_) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__10.message_);
              iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                       keys._M_t.
                                       super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl
                                       ,1,ech_config.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                       (long)ech_config.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ech_config.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
              gtest_ar__10.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__10.success_ = iVar2 == 0;
              if (!gtest_ar__10.success_) {
                testing::Message::Message((Message *)&local_390);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                           (AssertionResult *)
                           "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                           ,"true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_378,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x84c,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
                testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_390);
                goto LAB_0015cc47;
              }
            }
            else {
              testing::Message::Message((Message *)&local_390);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                         (AssertionResult *)"MakeECHConfig(&ech_config, invalid_public_name)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x849,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
              testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_390);
LAB_0015cc47:
              testing::internal::AssertHelper::~AssertHelper(&local_378);
              std::__cxx11::string::~string((string *)&gtest_ar__8);
              if (local_390.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_390.data_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            ECHConfigParams::~ECHConfigParams(&invalid_public_name);
          }
          else {
            testing::Message::Message((Message *)&gtest_ar__10);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&invalid_public_name,(internal *)&gtest_ar__8,
                       (AssertionResult *)"MakeECHConfig(&ech_config, extensions)","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x840,(char *)CONCAT44(invalid_public_name._4_4_,invalid_public_name._0_4_))
            ;
            testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar__10);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            std::__cxx11::string::~string((string *)&invalid_public_name);
            if ((long *)CONCAT71(gtest_ar__10._1_7_,gtest_ar__10.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar__10._1_7_,gtest_ar__10.success_) + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__8.message_);
          }
          ECHConfigParams::~ECHConfigParams(&extensions);
        }
        else {
          testing::Message::Message((Message *)&gtest_ar__8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&extensions,(internal *)&invalid_public_name,
                     (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_aead)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x836,(char *)CONCAT44(extensions._4_4_,extensions._0_4_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
          std::__cxx11::string::~string((string *)&extensions);
          if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&invalid_public_name.public_name);
        }
        ECHConfigParams::~ECHConfigParams(&unsupported_aead);
      }
      else {
        testing::Message::Message((Message *)&invalid_public_name);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&unsupported_aead,(internal *)&extensions,
                   (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_kdf)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x82f,(char *)CONCAT44(unsupported_aead._4_4_,unsupported_aead._0_4_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__8,(Message *)&invalid_public_name);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
        std::__cxx11::string::~string((string *)&unsupported_aead);
        if ((long *)CONCAT44(invalid_public_name._4_4_,invalid_public_name._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(invalid_public_name._4_4_,invalid_public_name._0_4_) + 8))
                    ();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&extensions.public_name);
      }
      ECHConfigParams::~ECHConfigParams(&unsupported_kdf);
    }
    else {
      testing::Message::Message((Message *)&extensions);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&unsupported_kdf,(internal *)&unsupported_aead,
                 (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_version)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&invalid_public_name,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x825,(char *)CONCAT71(unsupported_kdf._1_7_,(undefined1)unsupported_kdf.version))
      ;
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&invalid_public_name,(Message *)&extensions);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&invalid_public_name);
      std::__cxx11::string::~string((string *)&unsupported_kdf);
      if ((long *)CONCAT44(extensions._4_4_,extensions._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(extensions._4_4_,extensions._0_4_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&unsupported_aead.public_name);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ECHConfigParams::~ECHConfigParams(&unsupported_version);
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
LAB_0015ccc8:
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
  return;
}

Assistant:

TEST(SSLTest, UnsupportedECHConfig) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  // Unsupported versions are rejected.
  ECHConfigParams unsupported_version;
  unsupported_version.version = 0xffff;
  unsupported_version.key = key.get();
  std::vector<uint8_t> ech_config;
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_version));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Unsupported cipher suites are rejected. (We only support HKDF-SHA256.)
  ECHConfigParams unsupported_kdf;
  unsupported_kdf.key = key.get();
  unsupported_kdf.cipher_suites = {0x002 /* HKDF-SHA384 */,
                                   EVP_HPKE_AES_128_GCM};
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_kdf));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
  ECHConfigParams unsupported_aead;
  unsupported_aead.key = key.get();
  unsupported_aead.cipher_suites = {EVP_HPKE_HKDF_SHA256, 0xffff};
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_aead));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));


  // Unsupported extensions are rejected.
  ECHConfigParams extensions;
  extensions.key = key.get();
  extensions.extensions = {0x00, 0x01, 0x00, 0x00};
  ASSERT_TRUE(MakeECHConfig(&ech_config, extensions));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Invalid public names are rejected.
  ECHConfigParams invalid_public_name;
  invalid_public_name.key = key.get();
  invalid_public_name.public_name = "dns_names_have_no_underscores.example";
  ASSERT_TRUE(MakeECHConfig(&ech_config, invalid_public_name));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
}